

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

int SUNLinSolSetup_SPBCGS(SUNLinearSolver S,SUNMatrix A)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = S->content;
  iVar3 = 0;
  if (*(code **)((long)pvVar2 + 0x30) != (code *)0x0) {
    iVar1 = (**(code **)((long)pvVar2 + 0x30))(*(undefined8 *)((long)pvVar2 + 0x40));
    pvVar2 = S->content;
    iVar3 = 0;
    if ((iVar1 != 0) && (iVar3 = 0x324, iVar1 < 0)) {
      iVar3 = -0x326;
    }
  }
  *(int *)((long)pvVar2 + 0x18) = iVar3;
  return iVar3;
}

Assistant:

int SUNLinSolSetup_SPBCGS(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);

  int status;
  SUNPSetupFn Psetup;
  void* PData;

  /* Set shortcuts to SPBCGS memory structures */
  Psetup = SPBCGS_CONTENT(S)->Psetup;
  PData  = SPBCGS_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL)
  {
    status = Psetup(PData);
    if (status != 0)
    {
      LASTFLAG(S) = (status < 0) ? SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  /* return with success */
  LASTFLAG(S) = SUN_SUCCESS;
  return (LASTFLAG(S));
}